

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O1

void spell_colorful(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  byte *pbVar1;
  bool bVar2;
  int iVar3;
  char *argument;
  CHAR_DATA *ch_00;
  char arg [500];
  AFFECT_DATA af;
  char arg1 [500];
  char local_488 [504];
  AFFECT_DATA local_290;
  char local_228 [512];
  
  argument = one_argument(target_name,local_228);
  one_argument(argument,local_488);
  if ((((local_228[0] != '\0') && (ch_00 = get_char_room(ch,local_228), ch_00 != (CHAR_DATA *)0x0))
      && (local_488[0] != '\0')) &&
     (((bVar2 = is_number(local_488), bVar2 && (iVar3 = atoi(local_488), -1 < iVar3)) &&
      (bVar2 = is_npc(ch_00), !bVar2)))) {
    init_affect(&local_290);
    local_290.where = 0;
    local_290.aftype = 4;
    local_290.level = ch->level;
    local_290.location = 0;
    local_290.modifier = 0;
    local_290.type = (short)sn;
    iVar3 = atoi(local_488);
    local_290.duration = (short)iVar3;
    local_290.end_fun = colorful_end;
    local_290.mod_name = 0;
    affect_to_char(ch_00,&local_290);
    pbVar1 = (byte *)((long)ch_00->comm + 3);
    *pbVar1 = *pbVar1 | 0x40;
    return;
  }
  send_to_char("Syntax: c colorful target duration\n\r",ch);
  return;
}

Assistant:

void spell_colorful(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	AFFECT_DATA af;
	char *parg, arg1[500], arg[500];
	CHAR_DATA *victim;

	parg = one_argument(target_name, arg1);
	one_argument(parg, arg);

	if (arg1[0] == '\0'
		|| !(victim = get_char_room(ch, arg1))
		|| arg[0] == '\0'
		|| !is_number(arg)
		|| atoi(arg) < 0
		|| is_npc(victim))
	{
		send_to_char("Syntax: c colorful target duration\n\r", ch);
		return;
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_COMMUNE;
	af.type = sn;
	af.level = ch->level;
	af.location = APPLY_NONE;
	af.modifier = 0;
	af.duration = atoi(arg);
	af.end_fun = colorful_end;
	af.mod_name = MOD_VISION;
	affect_to_char(victim, &af);

	SET_BIT(victim->comm, COMM_LOTS_O_COLOR);
}